

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Tags::Write(Tags *this,IMkvWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t stop;
  uint64_t tag_size;
  Tag *tag_1;
  int idx_1;
  int64_t start;
  Tag *tag;
  uint64 uStack_28;
  int idx;
  uint64_t payload_size;
  IMkvWriter *writer_local;
  Tags *this_local;
  
  if (writer == (IMkvWriter *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uStack_28 = 0;
    for (tag._4_4_ = 0; tag._4_4_ < this->tags_count_; tag._4_4_ = tag._4_4_ + 1) {
      uVar4 = Tag::Write(this->tags_ + tag._4_4_,(IMkvWriter *)0x0);
      uStack_28 = uVar4 + uStack_28;
    }
    bVar1 = WriteEbmlMasterElement(writer,0x1254c367,uStack_28);
    if (bVar1) {
      iVar2 = (*writer->_vptr_IMkvWriter[1])();
      for (tag_1._4_4_ = 0; tag_1._4_4_ < this->tags_count_; tag_1._4_4_ = tag_1._4_4_ + 1) {
        uVar4 = Tag::Write(this->tags_ + tag_1._4_4_,writer);
        if (uVar4 == 0) {
          return false;
        }
      }
      iVar3 = (*writer->_vptr_IMkvWriter[1])();
      if ((CONCAT44(extraout_var_00,iVar3) < CONCAT44(extraout_var,iVar2)) ||
         (CONCAT44(extraout_var_00,iVar3) - CONCAT44(extraout_var,iVar2) == uStack_28)) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Tags::Write(IMkvWriter* writer) const {
  if (writer == NULL)
    return false;

  uint64_t payload_size = 0;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];
    payload_size += tag.Write(NULL);
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvTags, payload_size))
    return false;

  const int64_t start = writer->Position();

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& tag = tags_[idx];

    const uint64_t tag_size = tag.Write(writer);
    if (tag_size == 0)  // error
      return 0;
  }

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != payload_size)
    return false;

  return true;
}